

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O2

RTPRawPacket * __thiscall jrtplib::RTPUDPv4Transmitter::GetNextPacket(RTPUDPv4Transmitter *this)

{
  _List_node_base *p_Var1;
  RTPRawPacket *pRVar2;
  
  if ((this->init == true) && (this->created == true)) {
    p_Var1 = (this->rawpacketlist).
             super__List_base<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_>.
             _M_impl._M_node.super__List_node_base._M_next;
    if (p_Var1 != (_List_node_base *)&this->rawpacketlist) {
      pRVar2 = (RTPRawPacket *)p_Var1[1]._M_next;
      std::__cxx11::list<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_>::
      pop_front(&this->rawpacketlist);
      return pRVar2;
    }
  }
  return (RTPRawPacket *)0x0;
}

Assistant:

RTPRawPacket *RTPUDPv4Transmitter::GetNextPacket()
{
	if (!init)
		return 0;
	
	MAINMUTEX_LOCK
	
	RTPRawPacket *p;
	
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return 0;
	}
	if (rawpacketlist.empty())
	{
		MAINMUTEX_UNLOCK
		return 0;
	}

	p = *(rawpacketlist.begin());
	rawpacketlist.pop_front();

	MAINMUTEX_UNLOCK
	return p;
}